

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O3

void Qentem::QTest::PrintInfo(void)

{
  long *plVar1;
  wchar_t wVar2;
  char *pcVar3;
  char *pcVar4;
  wchar_t *pwVar5;
  wostream *pwVar6;
  wchar_t local_20;
  wchar_t local_1c;
  
  pcVar3 = TestOutPut::GetColor(TITLE);
  pcVar4 = TestOutPut::GetColor(END);
  pwVar6 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar6 = (wostream *)&std::wcout;
  }
  pwVar6 = std::operator<<(pwVar6,pcVar3);
  pwVar6 = std::operator<<(pwVar6,"Configurations");
  pwVar6 = std::operator<<(pwVar6,pcVar4);
  std::operator<<(pwVar6,":\n");
  pwVar6 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar6 = (wostream *)&std::wcout;
  }
  std::operator<<(pwVar6,"Arch: 64-bit\n");
  pwVar6 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar6 = (wostream *)&std::wcout;
  }
  pwVar6 = std::operator<<(pwVar6,"SizeT: ");
  pwVar6 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar6);
  std::operator<<(pwVar6," bytes:\n");
  pwVar6 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar6 = (wostream *)&std::wcout;
  }
  std::operator<<(pwVar6,"Endianness: Little-Endian\n");
  pwVar6 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar6 = (wostream *)&std::wcout;
  }
  std::operator<<(pwVar6,"Streaming SIMD Extensions 2: On\n");
  pwVar6 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar6 = (wostream *)&std::wcout;
  }
  std::operator<<(pwVar6,"Auto Escape HTML: On\n");
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    plVar1 = *(long **)(*(long *)(std::wcout + -0x18) + 0x108128);
    if (plVar1 == (long *)0x0) goto LAB_00103ab8;
    wVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,10);
    pwVar6 = (wostream *)&std::wcout;
    pwVar5 = &local_20;
  }
  else {
    plVar1 = *(long **)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x100 +
                       *(long *)(*(long *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ +
                                          0x10) + -0x18));
    if (plVar1 == (long *)0x0) {
LAB_00103ab8:
      std::__throw_bad_cast();
    }
    pwVar6 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
    wVar2 = (**(code **)(*plVar1 + 0x50))(plVar1,10);
    pwVar5 = &local_1c;
  }
  *pwVar5 = wVar2;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar6,pwVar5,1);
  return;
}

Assistant:

QENTEM_NOINLINE static void PrintInfo() {
        TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::TITLE), "Configurations",
                          TestOutPut::GetColor(TestOutPut::Colors::END), ":\n");
        if QENTEM_CONST_EXPRESSION (Config::Is64bit) {
            TestOutPut::Print("Arch: 64-bit\n");
        } else {
            TestOutPut::Print("Arch: 32-bit\n");
        }

        TestOutPut::Print("SizeT: ", sizeof(SizeT), " bytes:\n");

        if QENTEM_CONST_EXPRESSION (Config::IsBigEndian) {
            TestOutPut::Print("Endianness: Big-Endian\n");
        } else {
            TestOutPut::Print("Endianness: Little-Endian\n");
        }
#if defined(QENTEM_AVX2) && (QENTEM_AVX2 == 1)
        TestOutPut::Print("Advanced Vector Extensions: On\n");
#endif

#if defined(QENTEM_SSE2) && (QENTEM_SSE2 == 1)
        TestOutPut::Print("Streaming SIMD Extensions 2: On\n");
#endif

#if defined(QENTEM_MSIMD128) && (QENTEM_MSIMD128 == 1)
        TestOutPut::Print("WASM SIMD128: On\n");
#endif

        if QENTEM_CONST_EXPRESSION (Config::AutoEscapeHTML) {
            TestOutPut::Print("Auto Escape HTML: On\n");
        }

        TestOutPut::Print('\n');
    }